

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloop.cpp
# Opt level: O2

void __thiscall
testloop_handlers::Input_Event_Notify
          (testloop_handlers *this,Am_Drawonable *param_1,Am_Input_Event *ev)

{
  bool bVar1;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_14,"LEFT_DOWN",true);
  bVar1 = Am_Input_Char::operator==(&ev->input_char,local_14);
  if (bVar1) {
    test_reparent1();
  }
  else {
    Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_18,"MIDDLE_DOWN",true);
    bVar1 = Am_Input_Char::operator==(&ev->input_char,local_18);
    if (bVar1) {
      (**(code **)(*(long *)d2 + 0x50))(d2,0,0);
    }
    else {
      Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_1c,"RIGHT_DOWN",true);
      bVar1 = Am_Input_Char::operator==(&ev->input_char,local_1c);
      if (bVar1) {
        bVar1 = Input_Event_Notify::visible == false;
        Input_Event_Notify::visible = (bool)(Input_Event_Notify::visible ^ 1);
        (**(code **)(*(long *)d2 + 0x70))(d2,bVar1);
      }
    }
  }
  return;
}

Assistant:

void Input_Event_Notify(Am_Drawonable *, Am_Input_Event *ev) override
  {
    if (ev->input_char == "LEFT_DOWN")
      test_reparent1();
    else if (ev->input_char == "MIDDLE_DOWN")
      d2->Set_Position(0, 0);
    else if (ev->input_char == "RIGHT_DOWN") {
      static bool visible = true;
      if (visible == true)
        visible = false;
      else
        visible = true;
      d2->Set_Visible(visible);
    }
  }